

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O2

int mbedtls_asn1_write_len(uchar **p,uchar *start,size_t len)

{
  uchar *puVar1;
  bool bVar2;
  uint uVar3;
  size_t l;
  ulong uVar4;
  
  if (len >> 0x20 == 0) {
    uVar3 = 1;
    uVar4 = len;
    if (0x7f < len) {
      for (; uVar4 != 0; uVar4 = uVar4 >> 8) {
        uVar3 = uVar3 + 1;
      }
    }
    if ((long)*p - (long)start < (long)(ulong)uVar3) {
      uVar3 = 0xffffff94;
    }
    else {
      do {
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = (uchar)len;
        bVar2 = 0xff < len;
        len = len >> 8;
      } while (bVar2);
      if (1 < uVar3) {
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = (char)uVar3 + '\x7f';
        return uVar3;
      }
    }
  }
  else {
    uVar3 = 0xffffff9c;
  }
  return uVar3;
}

Assistant:

int mbedtls_asn1_write_len(unsigned char **p, const unsigned char *start, size_t len)
{
#if SIZE_MAX > 0xFFFFFFFF
    if (len > 0xFFFFFFFF) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
#endif

    int required = 1;

    if (len >= 0x80) {
        for (size_t l = len; l != 0; l >>= 8) {
            required++;
        }
    }

    if (required > (*p - start)) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    do {
        *--(*p) = MBEDTLS_BYTE_0(len);
        len >>= 8;
    } while (len);

    if (required > 1) {
        *--(*p) = (unsigned char) (0x80 + required - 1);
    }

    return required;
}